

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_ordinaryFunction_nativeApply
          (sysbvm_context_t *context,sysbvm_tuple_t function,
          sysbvm_functionEntryPoint_t nativeEntryPoint,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t result;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_bitflags_t applicationFlags_local;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_functionEntryPoint_t nativeEntryPoint_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  result = 0;
  argumentsRecord.previous._0_4_ = 0;
  argumentsRecord._8_8_ = argumentCount;
  argumentsRecord.rootCount = (size_t)arguments;
  argumentsRecord.roots = (sysbvm_tuple_t *)applicationFlags;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&result);
  sVar1 = (*nativeEntryPoint)(context,function,argumentCount,arguments);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&result);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_nativeApply(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_functionEntryPoint_t nativeEntryPoint, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    (void)applicationFlags;
    sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
        .rootCount = argumentCount,
        .roots = arguments
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    sysbvm_tuple_t result = nativeEntryPoint(context, function, argumentCount, arguments);
        
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
    return result;
}